

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O2

int fl_utf_tolower(uchar *str,int len,char *buf)

{
  uint uVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int l1;
  char *local_38;
  
  uVar5 = 0;
  uVar4 = 0;
  local_38 = buf;
  while ((int)uVar4 < len) {
    uVar1 = fl_utf8decode((char *)(str + uVar4),(char *)(str + len),&l1);
    uVar1 = XUtf8Tolower(uVar1);
    wVar2 = fl_utf8encode(uVar1,local_38 + uVar5);
    iVar3 = l1;
    if (l1 < 2) {
      iVar3 = 1;
    }
    uVar4 = uVar4 + iVar3;
    if (wVar2 < L'\x02') {
      wVar2 = L'\x01';
    }
    uVar5 = (ulong)(uint)((int)uVar5 + wVar2);
  }
  return (int)uVar5;
}

Assistant:

int fl_utf_tolower(const unsigned char *str, int len, char *buf)
{
  int i;
  int l = 0;
  char *end = (char *)&str[len];
  for (i = 0; i < len;) {
    int l1, l2;
    unsigned int u1;

    u1 = fl_utf8decode((const char*)(str + i), end, &l1);
    l2 = fl_utf8encode((unsigned int) XUtf8Tolower(u1), buf + l);
    if (l1 < 1) {
      i += 1;
    } else {
      i += l1;
    }
    if (l2 < 1) {
      l += 1;
    } else {
      l += l2;
    }
  }
  return l;
}